

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveExprStep(Walker *pWalker,Expr *pExpr)

{
  byte *pbVar1;
  byte bVar2;
  u8 enc;
  char cVar3;
  NameContext *pNC;
  Parse *pParse;
  ExprList *p;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *p_Var4;
  ushort uVar5;
  int iVar6;
  Expr *pEVar7;
  char *pcVar8;
  FuncDef *pFVar9;
  char *zTab;
  Expr *pEVar10;
  char *pcVar11;
  NameContext *pNVar12;
  uint uVar13;
  SrcList *local_78;
  undefined8 local_70;
  char *local_68;
  Walker local_60;
  
  uVar13 = pExpr->flags;
  if ((uVar13 & 4) != 0) {
    return 1;
  }
  pNC = (pWalker->u).pNC;
  pParse = pNC->pParse;
  pExpr->flags = uVar13 | 4;
  bVar2 = pExpr->op;
  if (bVar2 < 0x77) {
    if (bVar2 != 0x14) {
      if (bVar2 == 0x1b) {
        pcVar8 = (pExpr->u).zToken;
        pcVar11 = (char *)0x0;
        zTab = (char *)0x0;
LAB_00154313:
        iVar6 = lookupName(pParse,pcVar11,zTab,pcVar8,pNC,pExpr);
        return iVar6;
      }
      if (bVar2 != 0x4b) goto LAB_001542c4;
    }
  }
  else {
    if (0x86 < bVar2) {
      if (bVar2 != 0x87) {
        if (bVar2 != 0x99) goto LAB_001542c4;
        p = (pExpr->x).pList;
        if (p == (ExprList *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = p->nExpr;
        }
        enc = pParse->db->enc;
        if ((pNC->ncFlags & 0x10) != 0) {
          sqlite3ErrorMsg(pParse,"%s prohibited in partial index WHERE clauses","functions");
        }
        pcVar11 = (pExpr->u).zToken;
        if (pcVar11 == (char *)0x0) {
          uVar13 = 0;
        }
        else {
          uVar13 = 0xffffffff;
          pcVar8 = pcVar11;
          do {
            uVar13 = uVar13 + 1;
            cVar3 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar3 != '\0');
          uVar13 = uVar13 & 0x3fffffff;
        }
        pFVar9 = sqlite3FindFunction(pParse->db,pcVar11,uVar13,iVar6,enc,'\0');
        local_68 = pcVar11;
        if (pFVar9 == (FuncDef *)0x0) {
          pFVar9 = sqlite3FindFunction(pParse->db,pcVar11,uVar13,-2,enc,'\0');
          if (pFVar9 == (FuncDef *)0x0) {
            if ((pParse->db->init).busy != '\0') goto LAB_001544f6;
            pcVar11 = "no such function: %.*s";
          }
          else {
            pcVar11 = "wrong number of arguments to function %.*s()";
          }
        }
        else {
          p_Var4 = pFVar9->xFunc;
          if ((pFVar9->funcFlags & 0x400) != 0) {
            pExpr->flags = pExpr->flags | 0x41000;
            if (iVar6 == 2) {
              iVar6 = exprProbability(p->a[1].pExpr);
              pExpr->iTable = iVar6;
              if (iVar6 < 0) {
                sqlite3ErrorMsg(pParse,
                                "second argument to likelihood() must be a constant between 0.0 and 1.0"
                               );
                pNC->nErr = pNC->nErr + 1;
              }
            }
            else {
              iVar6 = 0x7800000;
              if (*pFVar9->zName == 'u') {
                iVar6 = 0x800000;
              }
              pExpr->iTable = iVar6;
            }
          }
          iVar6 = sqlite3AuthCheck(pParse,0x1f,(char *)0x0,pFVar9->zName,(char *)0x0);
          if (iVar6 != 0) {
            if (iVar6 == 1) {
              sqlite3ErrorMsg(pParse,"not authorized to use function: %s",pFVar9->zName);
              pNC->nErr = pNC->nErr + 1;
            }
            pExpr->op = 'e';
            return 1;
          }
          if ((pFVar9->funcFlags & 0x800) != 0) {
            pbVar1 = (byte *)((long)&pExpr->flags + 2);
            *pbVar1 = *pbVar1 | 8;
          }
          if (p_Var4 != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0)
          goto LAB_001544f6;
          if ((pNC->ncFlags & 1) != 0) {
            pNC->ncFlags = pNC->ncFlags & 0xfffe;
            sqlite3WalkExprList(pWalker,p);
            pExpr->op = 0x9b;
            pExpr->op2 = '\0';
            pNVar12 = pNC;
            while( true ) {
              local_78 = pNVar12->pSrcList;
              local_60.pParse = (Parse *)0x0;
              local_60.walkerDepth = 0;
              local_60.eCode = '\0';
              local_60._37_3_ = 0;
              local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
              local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
              local_60.xExprCallback = exprSrcCount;
              local_60.u.pNC = (NameContext *)&local_78;
              local_70 = 0;
              sqlite3WalkExprList(&local_60,(pExpr->x).pList);
              if ((0 < (int)local_70) || (local_70._4_4_ == 0)) break;
              pExpr->op2 = pExpr->op2 + '\x01';
              pNVar12 = pNVar12->pNext;
              if (pNVar12 == (NameContext *)0x0) {
LAB_001545c4:
                *(byte *)&pNC->ncFlags = (byte)pNC->ncFlags | 1;
                return 1;
              }
            }
            pNVar12->ncFlags = pFVar9->funcFlags & 0x1000 | pNVar12->ncFlags | 2;
            goto LAB_001545c4;
          }
          pcVar11 = "misuse of aggregate function %.*s()";
        }
        sqlite3ErrorMsg(pParse,pcVar11,(ulong)uVar13,local_68);
        pNC->nErr = pNC->nErr + 1;
LAB_001544f6:
        sqlite3WalkExprList(pWalker,p);
        return 1;
      }
      uVar5 = pNC->ncFlags;
      if ((uVar5 & 4) != 0) {
        sqlite3ErrorMsg(pParse,"%s prohibited in CHECK constraints","parameters");
        uVar5 = pNC->ncFlags;
      }
      if ((uVar5 & 0x10) != 0) {
        sqlite3ErrorMsg(pParse,"%s prohibited in partial index WHERE clauses","parameters");
      }
      goto LAB_001542c4;
    }
    if (bVar2 != 0x77) {
      if (bVar2 == 0x7a) {
        pEVar10 = pExpr->pRight;
        if (pEVar10->op == '\x1b') {
          pcVar11 = (char *)0x0;
          pEVar7 = pEVar10;
          pEVar10 = pExpr;
        }
        else {
          pcVar11 = (pExpr->pLeft->u).zToken;
          pEVar7 = pEVar10->pRight;
        }
        pcVar8 = (pEVar7->u).zToken;
        zTab = (pEVar10->pLeft->u).zToken;
        goto LAB_00154313;
      }
      goto LAB_001542c4;
    }
  }
  if ((uVar13 >> 0xb & 1) != 0) {
    iVar6 = pNC->nRef;
    uVar5 = pNC->ncFlags;
    if ((uVar5 & 4) != 0) {
      sqlite3ErrorMsg(pParse,"%s prohibited in CHECK constraints","subqueries");
      uVar5 = pNC->ncFlags;
    }
    if ((uVar5 & 0x10) != 0) {
      sqlite3ErrorMsg(pParse,"%s prohibited in partial index WHERE clauses","subqueries");
    }
    sqlite3WalkSelect(pWalker,(pExpr->x).pSelect);
    if (iVar6 != pNC->nRef) {
      *(byte *)&pExpr->flags = (byte)pExpr->flags | 0x20;
    }
  }
LAB_001542c4:
  iVar6 = 2;
  if (pParse->nErr == 0) {
    iVar6 = (uint)(pParse->db->mallocFailed != '\0') * 2;
  }
  return iVar6;
}

Assistant:

static int resolveExprStep(Walker *pWalker, Expr *pExpr){
  NameContext *pNC;
  Parse *pParse;

  pNC = pWalker->u.pNC;
  assert( pNC!=0 );
  pParse = pNC->pParse;
  assert( pParse==pWalker->pParse );

  if( ExprHasProperty(pExpr, EP_Resolved) ) return WRC_Prune;
  ExprSetProperty(pExpr, EP_Resolved);
#ifndef NDEBUG
  if( pNC->pSrcList && pNC->pSrcList->nAlloc>0 ){
    SrcList *pSrcList = pNC->pSrcList;
    int i;
    for(i=0; i<pNC->pSrcList->nSrc; i++){
      assert( pSrcList->a[i].iCursor>=0 && pSrcList->a[i].iCursor<pParse->nTab);
    }
  }
#endif
  switch( pExpr->op ){

#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) && !defined(SQLITE_OMIT_SUBQUERY)
    /* The special operator TK_ROW means use the rowid for the first
    ** column in the FROM clause.  This is used by the LIMIT and ORDER BY
    ** clause processing on UPDATE and DELETE statements.
    */
    case TK_ROW: {
      SrcList *pSrcList = pNC->pSrcList;
      struct SrcList_item *pItem;
      assert( pSrcList && pSrcList->nSrc==1 );
      pItem = pSrcList->a; 
      pExpr->op = TK_COLUMN;
      pExpr->pTab = pItem->pTab;
      pExpr->iTable = pItem->iCursor;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
      break;
    }
#endif /* defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
          && !defined(SQLITE_OMIT_SUBQUERY) */

    /* A lone identifier is the name of a column.
    */
    case TK_ID: {
      return lookupName(pParse, 0, 0, pExpr->u.zToken, pNC, pExpr);
    }
  
    /* A table name and column name:     ID.ID
    ** Or a database, table and column:  ID.ID.ID
    */
    case TK_DOT: {
      const char *zColumn;
      const char *zTable;
      const char *zDb;
      Expr *pRight;

      /* if( pSrcList==0 ) break; */
      pRight = pExpr->pRight;
      if( pRight->op==TK_ID ){
        zDb = 0;
        zTable = pExpr->pLeft->u.zToken;
        zColumn = pRight->u.zToken;
      }else{
        assert( pRight->op==TK_DOT );
        zDb = pExpr->pLeft->u.zToken;
        zTable = pRight->pLeft->u.zToken;
        zColumn = pRight->pRight->u.zToken;
      }
      return lookupName(pParse, zDb, zTable, zColumn, pNC, pExpr);
    }

    /* Resolve function names
    */
    case TK_FUNCTION: {
      ExprList *pList = pExpr->x.pList;    /* The argument list */
      int n = pList ? pList->nExpr : 0;    /* Number of arguments */
      int no_such_func = 0;       /* True if no such function exists */
      int wrong_num_args = 0;     /* True if wrong number of arguments */
      int is_agg = 0;             /* True if is an aggregate function */
      int auth;                   /* Authorization to use the function */
      int nId;                    /* Number of characters in function name */
      const char *zId;            /* The function name. */
      FuncDef *pDef;              /* Information about the function */
      u8 enc = ENC(pParse->db);   /* The database encoding */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      notValidPartIdxWhere(pParse, pNC, "functions");
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(pParse->db, zId, nId, n, enc, 0);
      if( pDef==0 ){
        pDef = sqlite3FindFunction(pParse->db, zId, nId, -2, enc, 0);
        if( pDef==0 ){
          no_such_func = 1;
        }else{
          wrong_num_args = 1;
        }
      }else{
        is_agg = pDef->xFunc==0;
        if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
          ExprSetProperty(pExpr, EP_Unlikely|EP_Skip);
          if( n==2 ){
            pExpr->iTable = exprProbability(pList->a[1].pExpr);
            if( pExpr->iTable<0 ){
              sqlite3ErrorMsg(pParse,
                "second argument to likelihood() must be a "
                "constant between 0.0 and 1.0");
              pNC->nErr++;
            }
          }else{
            /* EVIDENCE-OF: R-61304-29449 The unlikely(X) function is
            ** equivalent to likelihood(X, 0.0625).
            ** EVIDENCE-OF: R-01283-11636 The unlikely(X) function is
            ** short-hand for likelihood(X,0.0625).
            ** EVIDENCE-OF: R-36850-34127 The likely(X) function is short-hand
            ** for likelihood(X,0.9375).
            ** EVIDENCE-OF: R-53436-40973 The likely(X) function is equivalent
            ** to likelihood(X,0.9375). */
            /* TUNING: unlikely() probability is 0.0625.  likely() is 0.9375 */
            pExpr->iTable = pDef->zName[0]=='u' ? 8388608 : 125829120;
          }             
        }
#ifndef SQLITE_OMIT_AUTHORIZATION
        auth = sqlite3AuthCheck(pParse, SQLITE_FUNCTION, 0, pDef->zName, 0);
        if( auth!=SQLITE_OK ){
          if( auth==SQLITE_DENY ){
            sqlite3ErrorMsg(pParse, "not authorized to use function: %s",
                                    pDef->zName);
            pNC->nErr++;
          }
          pExpr->op = TK_NULL;
          return WRC_Prune;
        }
#endif
        if( pDef->funcFlags & SQLITE_FUNC_CONSTANT ){
          ExprSetProperty(pExpr,EP_ConstFunc);
        }
      }
      if( is_agg && (pNC->ncFlags & NC_AllowAgg)==0 ){
        sqlite3ErrorMsg(pParse, "misuse of aggregate function %.*s()", nId,zId);
        pNC->nErr++;
        is_agg = 0;
      }else if( no_such_func && pParse->db->init.busy==0 ){
        sqlite3ErrorMsg(pParse, "no such function: %.*s", nId, zId);
        pNC->nErr++;
      }else if( wrong_num_args ){
        sqlite3ErrorMsg(pParse,"wrong number of arguments to function %.*s()",
             nId, zId);
        pNC->nErr++;
      }
      if( is_agg ) pNC->ncFlags &= ~NC_AllowAgg;
      sqlite3WalkExprList(pWalker, pList);
      if( is_agg ){
        NameContext *pNC2 = pNC;
        pExpr->op = TK_AGG_FUNCTION;
        pExpr->op2 = 0;
        while( pNC2 && !sqlite3FunctionUsesThisSrc(pExpr, pNC2->pSrcList) ){
          pExpr->op2++;
          pNC2 = pNC2->pNext;
        }
        assert( pDef!=0 );
        if( pNC2 ){
          assert( SQLITE_FUNC_MINMAX==NC_MinMaxAgg );
          testcase( (pDef->funcFlags & SQLITE_FUNC_MINMAX)!=0 );
          pNC2->ncFlags |= NC_HasAgg | (pDef->funcFlags & SQLITE_FUNC_MINMAX);

        }
        pNC->ncFlags |= NC_AllowAgg;
      }
      /* FIX ME:  Compute pExpr->affinity based on the expected return
      ** type of the function 
      */
      return WRC_Prune;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT:
    case TK_EXISTS:  testcase( pExpr->op==TK_EXISTS );
#endif
    case TK_IN: {
      testcase( pExpr->op==TK_IN );
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        int nRef = pNC->nRef;
        notValidCheckConstraint(pParse, pNC, "subqueries");
        notValidPartIdxWhere(pParse, pNC, "subqueries");
        sqlite3WalkSelect(pWalker, pExpr->x.pSelect);
        assert( pNC->nRef>=nRef );
        if( nRef!=pNC->nRef ){
          ExprSetProperty(pExpr, EP_VarSelect);
        }
      }
      break;
    }
    case TK_VARIABLE: {
      notValidCheckConstraint(pParse, pNC, "parameters");
      notValidPartIdxWhere(pParse, pNC, "parameters");
      break;
    }
  }
  return (pParse->nErr || pParse->db->mallocFailed) ? WRC_Abort : WRC_Continue;
}